

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O1

InsertResult __thiscall
wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>::insert
          (OrderedFixedStorage<wasm::LocalSet_*,_2UL> *this,LocalSet **x)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used;
  bVar5 = uVar1 != 0;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    if ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[0] < *x) {
      uVar4 = 0;
      do {
        uVar3 = uVar1;
        if (uVar1 - 1 == uVar4) goto LAB_0016b0ca;
        uVar3 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar3;
      } while ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[lVar2] < *x);
      bVar5 = uVar3 < uVar1;
    }
    else {
      uVar3 = 0;
    }
    if ((bVar5) &&
       ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar3] == *x)) {
      return NoError;
    }
  }
LAB_0016b0ca:
  if (2 < uVar1) {
    __assert_fail("this->used <= N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                  ,99,
                  "InsertResult wasm::OrderedFixedStorage<wasm::LocalSet *, 2>::insert(const T &) [T = wasm::LocalSet *, N = 2]"
                 );
  }
  if (uVar1 != 2) {
    if (uVar3 != uVar1) {
      for (uVar4 = uVar1; uVar3 + 1 <= uVar4; uVar4 = uVar4 - 1) {
        (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar4] =
             (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar4 - 1];
      }
    }
    (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar3] = *x;
    (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used = uVar1 + 1;
    return NoError;
  }
  return CouldNotInsert;
}

Assistant:

InsertResult insert(const T& x) {
    // Find the insertion point |i| where x should be placed.
    size_t i = 0;
    while (i < this->used && this->storage[i] < x) {
      i++;
    }
    if (i < this->used && this->storage[i] == x) {
      // The item already exists.
      return InsertResult::NoError;
    }
    // |i| is now the location where x should be placed.

    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }

    if (i != this->used) {
      // Push things forward to make room for x.
      for (size_t j = this->used; j >= i + 1; j--) {
        this->storage[j] = this->storage[j - 1];
      }
    }

    this->storage[i] = x;
    this->used++;
    return InsertResult::NoError;
  }